

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

void __thiscall TreeIncPruneBGPlanner::Initialize(TreeIncPruneBGPlanner *this)

{
  Index IVar1;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *this_00;
  index iVar2;
  PlanningUnitDecPOMDPDiscrete *pPVar3;
  pair<long,_long> local_70;
  extent_gen<2UL> local_60;
  extent_gen<3UL> local_40;
  
  AlphaVectorPlanning::Initialize((AlphaVectorPlanning *)this);
  this_00 = (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
             *)operator_new(0xa0);
  pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  iVar2 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  local_70 = (pair<long,_long>)
             boost::detail::multi_array::extent_gen<0UL>::operator[]
                       ((extent_gen<0UL> *)boost::(anonymous_namespace)::extents,iVar2);
  pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  iVar2 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  boost::detail::multi_array::extent_gen<1UL>::operator[]
            (&local_60,(extent_gen<1UL> *)&local_70,iVar2);
  pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  iVar2 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  boost::detail::multi_array::extent_gen<2UL>::operator[](&local_40,&local_60,iVar2);
  boost::
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_3UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  ::multi_array(this_00,&local_40);
  this->_m_Gaoa = this_00;
  pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu;
  if (pPVar3 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar3 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
             _m_puShared.px;
  }
  IVar1 = (**(code **)((long)*(pPVar3->super_PlanningUnitMADPDiscrete)._m_madp + 200))();
  this->_m_maxDepth = IVar1;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
  ::clear(&(this->_m_vectorSetCache)._M_t);
  (this->super_MonahanBGPlanner).super_MonahanPlanner._m_initialized = true;
  return;
}

Assistant:

void TreeIncPruneBGPlanner::Initialize()
{
    AlphaVectorPlanning::Initialize();

    _m_Gaoa=new GaobetaVectorSet(boost::extents[GetPU()->GetNrJointActions()]
                                 [GetPU()->GetNrJointObservations()]
                                 [GetPU()->GetNrJointActions()]);

    _m_maxDepth=GetPU()->GetNrJointObservations();
    _m_vectorSetCache.clear();

    MonahanPlanner::_m_initialized=true;
}